

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltextureblitter.cpp
# Opt level: O0

bool __thiscall
QOpenGLTextureBlitterPrivate::prepareProgram
          (QOpenGLTextureBlitterPrivate *this,QMatrix4x4 *vertexTransform)

{
  bool bVar1;
  ProgramIndex __fd;
  socklen_t __len;
  sockaddr *__addr;
  sockaddr *__addr_00;
  GLuint __fd_00;
  undefined8 in_RSI;
  QOpenGLTextureBlitterPrivate *in_RDI;
  Program *program;
  ProgramIndex programIndex;
  GLenum in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  Program *this_00;
  int in_stack_ffffffffffffffe0;
  ProgramIndex offset;
  QOpenGLTextureBlitterPrivate *this_01;
  bool local_1;
  
  this_01 = in_RDI;
  __fd = targetToProgramIndex(in_stack_ffffffffffffffc8);
  offset = __fd;
  bVar1 = ensureProgram(this_01,(ProgramIndex)((ulong)in_RSI >> 0x20));
  if (bVar1) {
    this_00 = in_RDI->programs + offset;
    QOpenGLBuffer::bind(&in_RDI->vertexBuffer,__fd,__addr,offset * 0x30);
    QScopedPointer<QOpenGLShaderProgram,_QScopedPointerDeleter<QOpenGLShaderProgram>_>::operator->
              (&this_00->glProgram);
    __len = 0;
    QOpenGLShaderProgram::setAttributeBuffer
              ((QOpenGLShaderProgram *)this_01,(int)((ulong)in_RSI >> 0x20),(GLenum)in_RSI,offset,
               in_stack_ffffffffffffffe0,(int)((ulong)this_00 >> 0x20));
    QScopedPointer<QOpenGLShaderProgram,_QScopedPointerDeleter<QOpenGLShaderProgram>_>::operator->
              (&this_00->glProgram);
    QOpenGLShaderProgram::enableAttributeArray
              ((QOpenGLShaderProgram *)in_RDI,in_stack_ffffffffffffffcc);
    QOpenGLBuffer::release((QOpenGLBuffer *)in_RDI);
    QScopedPointer<QOpenGLShaderProgram,_QScopedPointerDeleter<QOpenGLShaderProgram>_>::operator->
              (&this_00->glProgram);
    __fd_00 = this_00->vertexTransformUniformPos;
    QOpenGLShaderProgram::setUniformValue
              ((QOpenGLShaderProgram *)this_01,(int)((ulong)in_RSI >> 0x20),
               (QMatrix4x4 *)CONCAT44(offset,in_stack_ffffffffffffffe0));
    QOpenGLBuffer::bind(&in_RDI->textureBuffer,__fd_00,__addr_00,__len);
    QScopedPointer<QOpenGLShaderProgram,_QScopedPointerDeleter<QOpenGLShaderProgram>_>::operator->
              (&this_00->glProgram);
    QOpenGLShaderProgram::setAttributeBuffer
              ((QOpenGLShaderProgram *)this_01,(int)((ulong)in_RSI >> 0x20),(GLenum)in_RSI,offset,
               in_stack_ffffffffffffffe0,(int)((ulong)this_00 >> 0x20));
    QScopedPointer<QOpenGLShaderProgram,_QScopedPointerDeleter<QOpenGLShaderProgram>_>::operator->
              (&this_00->glProgram);
    QOpenGLShaderProgram::enableAttributeArray
              ((QOpenGLShaderProgram *)in_RDI,in_stack_ffffffffffffffcc);
    QOpenGLBuffer::release((QOpenGLBuffer *)in_RDI);
    if ((in_RDI->swizzle & 1U) != (this_00->swizzle & 1U)) {
      QScopedPointer<QOpenGLShaderProgram,_QScopedPointerDeleter<QOpenGLShaderProgram>_>::operator->
                (&this_00->glProgram);
      QOpenGLShaderProgram::setUniformValue
                ((QOpenGLShaderProgram *)in_RDI,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)
      ;
      this_00->swizzle = (bool)(in_RDI->swizzle & 1);
    }
    if ((in_RDI->opacity != this_00->opacity) || (NAN(in_RDI->opacity) || NAN(this_00->opacity))) {
      QScopedPointer<QOpenGLShaderProgram,_QScopedPointerDeleter<QOpenGLShaderProgram>_>::operator->
                (&this_00->glProgram);
      QOpenGLShaderProgram::setUniformValue
                ((QOpenGLShaderProgram *)in_RDI,in_stack_ffffffffffffffcc,
                 (GLfloat)((ulong)this_00 >> 0x20));
      this_00->opacity = in_RDI->opacity;
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool QOpenGLTextureBlitterPrivate::prepareProgram(const QMatrix4x4 &vertexTransform)
{
    ProgramIndex programIndex = targetToProgramIndex(currentTarget);
    if (!ensureProgram(programIndex))
        return false;

    Program *program = &programs[programIndex];

    vertexBuffer.bind();
    program->glProgram->setAttributeBuffer(program->vertexCoordAttribPos, GL_FLOAT, 0, 3, 0);
    program->glProgram->enableAttributeArray(program->vertexCoordAttribPos);
    vertexBuffer.release();

    program->glProgram->setUniformValue(program->vertexTransformUniformPos, vertexTransform);

    textureBuffer.bind();
    program->glProgram->setAttributeBuffer(program->textureCoordAttribPos, GL_FLOAT, 0, 2, 0);
    program->glProgram->enableAttributeArray(program->textureCoordAttribPos);
    textureBuffer.release();

    if (swizzle != program->swizzle) {
        program->glProgram->setUniformValue(program->swizzleUniformPos, swizzle);
        program->swizzle = swizzle;
    }

    if (opacity != program->opacity) {
        program->glProgram->setUniformValue(program->opacityUniformPos, opacity);
        program->opacity = opacity;
    }

    return true;
}